

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_while::statement_while
          (statement_while *this,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RCX;
  context_t *in_RSI;
  undefined8 *in_RDI;
  token_base *eptr;
  statement_base *in_stack_ffffffffffffffa0;
  token_base local_38 [3];
  
  eptr = local_38;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)eptr,(shared_ptr<cs::context_type> *)in_RCX);
  statement_base::statement_base(in_stack_ffffffffffffffa0,in_RSI,eptr);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x242af9);
  *in_RDI = &PTR__statement_while_003be4f8;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)eptr,(tree_type<cs::token_base_*> *)in_RCX);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)eptr,in_RCX);
  return;
}

Assistant:

statement_while(tree_type<token_base *> tree, std::deque<statement_base *> b, context_t c,
		                token_base *ptr) : statement_base(std::move(c), ptr), mTree(std::move(tree)),
			mBlock(std::move(b)) {}